

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

ProceduralBlockSymbol *
slang::ast::ProceduralBlockSymbol::createProceduralBlock
          (Scope *scope,ProceduralBlockKind kind,SourceLocation location,bool isFromAssertion,
          MemberSyntax *syntax,StatementSyntax *stmtSyntax)

{
  char *pcVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  pointer ppSVar2;
  ProceduralBlockSymbol *this;
  long lVar3;
  long lVar4;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar5;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> extraMembers;
  bool local_7d;
  ProceduralBlockKind local_7c;
  SourceLocation local_78;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> local_70;
  
  local_7d = isFromAssertion;
  local_7c = kind;
  local_78 = location;
  this = BumpAllocator::
         emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&,bool&>
                   (&scope->compilation->super_BumpAllocator,&local_78,&local_7c,&local_7d);
  (this->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  syntax_00._M_ptr =
       (syntax->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->attributes).
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  this->stmtSyntax = stmtSyntax;
  pcVar1 = local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ = (pointer)pcVar1;
  sVar5 = Statement::createBlockItems(scope,stmtSyntax,false,&local_70);
  this->blocks = sVar5;
  if (sVar5._M_extent._M_extent_value._M_extent_value != 0) {
    lVar3 = 0;
    do {
      Scope::insertMember(scope,*(Symbol **)((long)sVar5._M_ptr + lVar3),scope->lastMember,false,
                          true);
      lVar3 = lVar3 + 8;
    } while (sVar5._M_extent._M_extent_value._M_extent_value * 8 - lVar3 != 0);
  }
  ppSVar2 = local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_;
  if (local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len != 0) {
    lVar4 = local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len << 3;
    lVar3 = 0;
    do {
      Scope::addMembers(scope,*(SyntaxNode **)((long)ppSVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (lVar4 != lVar3);
  }
  if (local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ != (pointer)pcVar1) {
    operator_delete(local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_);
  }
  return this;
}

Assistant:

ProceduralBlockSymbol& ProceduralBlockSymbol::createProceduralBlock(
    Scope& scope, ProceduralBlockKind kind, SourceLocation location, bool isFromAssertion,
    const MemberSyntax& syntax, const StatementSyntax& stmtSyntax) {

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ProceduralBlockSymbol>(location, kind, isFromAssertion);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->stmtSyntax = &stmtSyntax;

    SmallVector<const SyntaxNode*> extraMembers;
    result->blocks = Statement::createBlockItems(scope, stmtSyntax, /* labelHandled */ false,
                                                 extraMembers);

    for (auto b : result->blocks)
        scope.addMember(*b);
    for (auto member : extraMembers)
        scope.addMembers(*member);

    return *result;
}